

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathDebugDumpNodeSet(FILE *output,xmlNodeSetPtr cur,int depth)

{
  undefined1 local_88 [8];
  char shift [100];
  int i;
  int depth_local;
  xmlNodeSetPtr cur_local;
  FILE *output_local;
  
  shift[0x60] = '\0';
  shift[0x61] = '\0';
  shift[0x62] = '\0';
  shift[99] = '\0';
  for (; (int)shift._96_4_ < depth && (int)shift._96_4_ < 0x19; shift._96_4_ = shift._96_4_ + 1) {
    local_88[shift._96_4_ * 2 + 1] = 0x20;
    local_88[(int)(shift._96_4_ << 1)] = 0x20;
  }
  local_88[shift._96_4_ * 2 + 1] = 0;
  local_88[(int)(shift._96_4_ << 1)] = 0;
  if (cur == (xmlNodeSetPtr)0x0) {
    fprintf((FILE *)output,"%s",local_88);
    fprintf((FILE *)output,"NodeSet is NULL !\n");
  }
  else if (cur != (xmlNodeSetPtr)0x0) {
    fprintf((FILE *)output,"Set contains %d nodes:\n",(ulong)(uint)cur->nodeNr);
    shift[0x60] = '\0';
    shift[0x61] = '\0';
    shift[0x62] = '\0';
    shift[99] = '\0';
    for (; (int)shift._96_4_ < cur->nodeNr; shift._96_4_ = shift._96_4_ + 1) {
      fprintf((FILE *)output,"%s",local_88);
      fprintf((FILE *)output,"%d",(ulong)(shift._96_4_ + 1));
      xmlXPathDebugDumpNode(output,cur->nodeTab[(int)shift._96_4_],depth + 1);
    }
  }
  return;
}

Assistant:

static void
xmlXPathDebugDumpNodeSet(FILE *output, xmlNodeSetPtr cur, int depth) {
    int i;
    char shift[100];

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;

    if (cur == NULL) {
	fprintf(output, "%s", shift);
	fprintf(output, "NodeSet is NULL !\n");
	return;

    }

    if (cur != NULL) {
	fprintf(output, "Set contains %d nodes:\n", cur->nodeNr);
	for (i = 0;i < cur->nodeNr;i++) {
	    fprintf(output, "%s", shift);
	    fprintf(output, "%d", i + 1);
	    xmlXPathDebugDumpNode(output, cur->nodeTab[i], depth + 1);
	}
    }
}